

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall ONX_Model::DumpComponentLists(ONX_Model *this,ON_TextLog *dump)

{
  undefined8 this_00;
  wchar_t *pwVar1;
  undefined1 local_38 [8];
  ON_wString type_name;
  ON__UINT64 OStack_28;
  uint i;
  Type table_types [16];
  ON_TextLog *dump_local;
  ONX_Model *this_local;
  
  table_types._8_8_ = dump;
  OStack_28 = 0x807060504030201;
  table_types[0] = RenderLight;
  table_types[1] = HatchPattern;
  table_types[2] = ModelGeometry;
  table_types[3] = HistoryRecord;
  table_types[4] = RenderContent;
  table_types[5] = EmbeddedFile;
  table_types[6] = SectionStyle;
  table_types[7] = Unset;
  for (type_name.m_s._4_4_ = 0;
      *(char *)((long)&stack0xffffffffffffffd8 + (ulong)type_name.m_s._4_4_) != '\0';
      type_name.m_s._4_4_ = type_name.m_s._4_4_ + 1) {
    ON_ModelComponent::ComponentTypeToString
              ((ON_ModelComponent *)local_38,
               *(Type *)((long)&stack0xffffffffffffffd8 + (ulong)type_name.m_s._4_4_));
    this_00 = table_types._8_8_;
    pwVar1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
    ON_TextLog::Print((ON_TextLog *)this_00,L"%ls table:\n",pwVar1);
    ON_TextLog::PushIndent((ON_TextLog *)table_types._8_8_);
    DumpComponentList(this,*(Type *)((long)&stack0xffffffffffffffd8 + (ulong)type_name.m_s._4_4_),
                      (ON_TextLog *)table_types._8_8_);
    ON_TextLog::PopIndent((ON_TextLog *)table_types._8_8_);
    ON_TextLog::Print((ON_TextLog *)table_types._8_8_,"\n");
    ON_wString::~ON_wString((ON_wString *)local_38);
  }
  return;
}

Assistant:

void ONX_Model::DumpComponentLists( ON_TextLog& dump ) const
{
  const ON_ModelComponent::Type table_types[] =
  {
    ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::Material,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::ModelGeometry,
    ON_ModelComponent::Type::HistoryRecord,
    ON_ModelComponent::Type::RenderContent,
    ON_ModelComponent::Type::EmbeddedFile,
    //ON_ModelComponent::Type::ObsoleteValue,
    ON_ModelComponent::Type::SectionStyle,
    ON_ModelComponent::Type::Unset // list terminator
  };

  for (unsigned i = 0; ON_ModelComponent::Type::Unset != table_types[i]; i++)
  {
    ON_wString type_name = ON_ModelComponent::ComponentTypeToString(table_types[i]);
    dump.Print(L"%ls table:\n",static_cast<const wchar_t*>(type_name));
    dump.PushIndent();
    DumpComponentList(table_types[i],dump);
    dump.PopIndent();
    dump.Print("\n");
  }
}